

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpatialStatistics.cpp
# Opt level: O2

void __thiscall OpenMD::SpatialStatistics::processFrame(SpatialStatistics *this,int param_1)

{
  uint uVar1;
  StuntDouble *this_00;
  int i;
  Vector3d pos;
  int local_64;
  SelectionSet local_60;
  Vector<double,_3U> local_48;
  
  if ((this->evaluator_).isDynamic_ == true) {
    SelectionEvaluator::evaluate(&local_60,&this->evaluator_);
    SelectionManager::setSelectionSet(&this->seleMan_,&local_60);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              (&local_60.bitsets_);
  }
  this_00 = SelectionManager::beginSelected(&this->seleMan_,&local_64);
  while (this_00 != (StuntDouble *)0x0) {
    StuntDouble::getPos((Vector3d *)&local_60,this_00);
    Vector<double,_3U>::Vector(&local_48,(Vector<double,_3U> *)&local_60);
    uVar1 = (*(this->super_StaticAnalyser)._vptr_StaticAnalyser[5])(this,&local_48);
    (*(this->super_StaticAnalyser)._vptr_StaticAnalyser[6])(this,this_00,(ulong)uVar1);
    this_00 = SelectionManager::nextSelected(&this->seleMan_,&local_64);
  }
  return;
}

Assistant:

void SpatialStatistics::processFrame(int) {
    StuntDouble* sd;
    int i;

    if (evaluator_.isDynamic()) {
      seleMan_.setSelectionSet(evaluator_.evaluate());
    }

    // loop over the selected atoms:
    for (sd = seleMan_.beginSelected(i); sd != NULL;
         sd = seleMan_.nextSelected(i)) {
      // figure out where that object is:
      Vector3d pos = sd->getPos();

      int bin = getBin(pos);

      // forward the work of statistics on to the subclass:
      processStuntDouble(sd, bin);
    }
  }